

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::drawIndexSample
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          vector<int,_std::allocator<int>_> *sample)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  reference __a;
  reference __b;
  iterator __first;
  vector<int,_std::allocator<int>_> *in_RSI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  uint i;
  size_t index_size;
  size_t sample_size;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  ulong in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb0;
  uint local_24;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8));
  for (local_24 = 0; local_24 < sVar2; local_24 = local_24 + 1) {
    __a = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8),(ulong)local_24);
    in_stack_ffffffffffffff98 = (vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8);
    in_stack_ffffffffffffff90 = (ulong)local_24;
    iVar1 = rnd((SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)0xbf7465);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    (in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90 + (ulong)(long)iVar1 % (sVar3 - local_24));
    std::swap<int>(__a,__b);
  }
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  __first = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  std::
  copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             in_stack_ffffffffffffffb0,in_RDI);
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::drawIndexSample(
    std::vector<int> & sample)
{
  size_t sample_size = sample.size();
  size_t index_size = shuffled_indices_.size();
  for( unsigned int i = 0; i < sample_size; ++i )
  {
    // The 1/(RAND_MAX+1.0) trick is when the random numbers are not uniformly
    // distributed and for small modulo elements, that does not matter
    // (and nowadays, random number generators are good)
    //std::swap (shuffled_indices_[i], shuffled_indices_[i + (rand () % (index_size - i))]);
    std::swap(
        shuffled_indices_[i],
        shuffled_indices_[i + (rnd() % (index_size - i))] );
  }
  std::copy(
      shuffled_indices_.begin(),
      shuffled_indices_.begin() + sample_size,
      sample.begin() );
}